

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Sintatico::operador_relacional(Sintatico *this)

{
  uint need;
  bool bVar1;
  undefined8 extraout_RAX;
  string sStack_e0;
  string sStack_c0;
  string sStack_a0;
  string sStack_80;
  string sStack_60;
  string sStack_40;
  
  need = this->tok;
  if ((0x1e < need) || ((0x70000070U >> (need & 0x1f) & 1) == 0)) {
    return;
  }
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,need);
  if (bVar1) {
    do {
      avancar(this);
      if (0x17 < (uint)this->tok) {
        return;
      }
    } while ((0x980000U >> (this->tok & 0x1fU) & 1) != 0);
    return;
  }
  if ((int)need < 0x20) {
    if (need == 0xd) {
      sStack_a0._M_dataplus._M_p = (pointer)&sStack_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_a0,")","");
      error(this,&sStack_a0);
      goto LAB_001025ad;
    }
    if (need != 0x12) {
      if (need != 0x15) {
        return;
      }
      sStack_40._M_dataplus._M_p = (pointer)&sStack_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_40,";","");
      error(this,&sStack_40);
      goto LAB_00102559;
    }
LAB_001025dc:
    sStack_80._M_dataplus._M_p = (pointer)&sStack_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_80,",","");
    error(this,&sStack_80);
  }
  else {
LAB_00102559:
    if (need == 0x20) {
LAB_001025ad:
      sStack_e0._M_dataplus._M_p = (pointer)&sStack_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_e0,"then","");
      error(this,&sStack_e0);
      goto LAB_001025dc;
    }
    if (need != 0x27) {
      if (need != 0x2a) {
        return;
      }
      goto LAB_00102640;
    }
  }
  sStack_60._M_dataplus._M_p = (pointer)&sStack_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_60,"program","");
  error(this,&sStack_60);
LAB_00102640:
  sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_c0,"do","");
  error(this,&sStack_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Sintatico::operador_relacional() {
  switch (tok) {
    case IGUAL     : eat(IGUAL)     ; break;
    case DIFERENTE : eat(DIFERENTE) ; break;
    case MENOR     : eat(MENOR)     ; break;
    case MENORIGUAL: eat(MENORIGUAL); break;
    case MAIORIGUAL: eat(MAIORIGUAL); break;
    case MAIOR     : eat(MAIOR)     ; break;
  }
}